

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

void __thiscall
FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete
          (FactoredDecPOMDPDiscrete *this,string *name,string *descr,string *pf)

{
  void **in_RCX;
  string *in_RDX;
  string *in_RSI;
  FactoredQFunctionScopeForStage *in_RDI;
  vector<Scope,_std::allocator<Scope>_> *this_00;
  pointer *this_01;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_ffffffffffffffd0;
  
  this_00 = &in_RDI[0x25]._m_sfacScopes;
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  POSGInterface::POSGInterface((POSGInterface *)this_00,&PTR_PTR_00d46358);
  DecPOMDPInterface::DecPOMDPInterface((DecPOMDPInterface *)this_00,&PTR_PTR_00d46340);
  this_01 = &in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_finish;
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            ((MultiAgentDecisionProcessDiscreteInterface *)this_01,
             &PTR_construction_vtable_384__00d46368);
  DecPOMDPDiscreteInterface::DecPOMDPDiscreteInterface
            ((DecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_232__00d46318);
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface::
  MultiAgentDecisionProcessDiscreteFactoredStatesInterface
            ((MultiAgentDecisionProcessDiscreteFactoredStatesInterface *)this_01,
             &PTR_construction_vtable_544__00d46378);
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  FactoredDecPOMDPDiscreteInterface::FactoredDecPOMDPDiscreteInterface
            ((FactoredDecPOMDPDiscreteInterface *)this_00,&PTR_construction_vtable_352__00d462e0);
  MultiAgentDecisionProcessDiscreteFactoredStates::MultiAgentDecisionProcessDiscreteFactoredStates
            (in_stack_ffffffffffffffd0,in_RCX,in_RDX,in_RSI,(string *)in_RDI);
  DecPOMDP::DecPOMDP((DecPOMDP *)(in_RDI + 0x20),&PTR_construction_vtable_176__00d46280);
  (in_RDI->_m_agentScopes).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xd45700;
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xd45cc8;
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xd45cc8;
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xd45cc8;
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xd45cc8;
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xd45cc8;
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xd46030;
  in_RDI[0x25]._m_sfacScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xd46030;
  in_RDI[0x20]._m_agentScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xd45ac8;
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaddebd);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xadded3);
  std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::vector
            ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)0xaddee9);
  FactoredQFunctionScopeForStage::FactoredQFunctionScopeForStage(in_RDI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaddf0d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xaddf1e);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaddf2f);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0xaddf40);
  in_RDI[0x25]._m_agentScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   &in_RDI[0x25]._m_agentScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = 0;
  *(undefined1 *)
   ((long)&in_RDI[0x25]._m_agentScopes.super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  return;
}

Assistant:

FactoredDecPOMDPDiscrete::FactoredDecPOMDPDiscrete(string name, string descr, string pf) :
    FactoredDecPOMDPDiscreteInterface()
    ,MultiAgentDecisionProcessDiscreteFactoredStates(name, descr, pf)   
    ,_m_p_rModel()
    ,_m_cached_FlatRM(false)
    ,_m_sparse_FlatRM(false)
{
 }